

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

int __thiscall llama_context::encode(llama_context *this,llama_batch *inp_batch)

{
  uint uVar1;
  llama_batch in_batch;
  long lVar2;
  bool bVar3;
  uint32_t uVar4;
  int32_t iVar5;
  int iVar6;
  reference pvVar7;
  pointer pgVar8;
  ggml_cgraph *gf_00;
  pointer plVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float *pfVar10;
  size_t __n;
  int *in_RSI;
  long *in_RDI;
  llama_seq_id seq_id_1;
  int s;
  int32_t i_3;
  llama_seq_id seq_id;
  int32_t i_2;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *embd_seq_out;
  ggml_backend_t backend_embd;
  ggml_tensor *t_embd;
  ggml_status compute_status;
  llm_graph_result_ptr res;
  ggml_cgraph *gf;
  bool causal_attn_org;
  int32_t i_1;
  llama_ubatch ubatch;
  int64_t n_embd;
  int32_t i;
  llama_hparams *hparams;
  int32_t n_tokens;
  llama_batch *batch;
  llama_batch_allocr batch_allocr;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *this_00;
  llama_context *this_01;
  unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *this_02;
  value_type_conflict3 *__x;
  llama_kv_cache_unified *in_stack_fffffffffffffd50;
  set<int,_std::less<int>,_std::allocator<int>_> *this_03;
  size_t n_ubatch;
  llama_sbatch *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *in_stack_fffffffffffffd70;
  llama_context *in_stack_fffffffffffffd80;
  undefined1 batched;
  void *__src;
  ggml_cgraph *in_stack_fffffffffffffd88;
  llama_context *in_stack_fffffffffffffd90;
  long lVar11;
  undefined8 in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined6 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  int8_t *in_stack_fffffffffffffdd0;
  llama_batch *in_stack_fffffffffffffdd8;
  llama_sbatch *in_stack_fffffffffffffde0;
  llama_context *in_stack_fffffffffffffde8;
  llm_graph_type gtype;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  int in_stack_fffffffffffffe00;
  llama_context *in_stack_fffffffffffffe08;
  int local_1c0;
  int local_1bc;
  _Self local_1b8;
  _Self local_1b0;
  int local_1a8;
  int local_1a4;
  long *local_1a0;
  long local_198;
  long local_190;
  ggml_status local_184;
  ggml_cgraph *local_178;
  byte local_16d;
  int local_16c;
  byte local_168 [40];
  long local_140;
  long local_138;
  ulong local_128;
  undefined4 local_11c;
  uint local_118;
  long local_108;
  uint local_fc;
  uint *local_f8;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_f0;
  llama_context *plStack_e8;
  unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *puStack_d8;
  value_type_conflict3 *local_d0;
  set<int,_std::less<int>,_std::allocator<int>_> *psStack_c8;
  size_t local_c0;
  uint local_b8 [2];
  long local_b0;
  long local_a8;
  int *local_18;
  int local_4;
  
  if (*in_RSI == 0) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: n_tokens == 0\n","encode");
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    memcpy(&local_f0,in_RSI,0x38);
    if (*(long *)(local_18 + 6) == 0) {
      std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
      operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *
                 )0x3dc859);
      llama_kv_cache_unified::pos_max(in_stack_fffffffffffffd50);
    }
    in_batch.token = (llama_token *)in_stack_fffffffffffffda8;
    in_batch._0_8_ = in_stack_fffffffffffffda0;
    in_batch.embd = (float *)in_stack_fffffffffffffdb0;
    in_batch.pos = (llama_pos *)in_stack_fffffffffffffdb8;
    in_batch.n_seq_id = (int32_t *)in_stack_fffffffffffffdc0;
    in_batch.seq_id._0_6_ = in_stack_fffffffffffffdc8;
    in_batch.seq_id._6_1_ = in_stack_fffffffffffffdce;
    in_batch.seq_id._7_1_ = in_stack_fffffffffffffdcf;
    in_batch.logits = in_stack_fffffffffffffdd0;
    llama_batch_allocr::llama_batch_allocr
              ((llama_batch_allocr *)in_stack_fffffffffffffd90,in_batch,
               (llama_pos)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    local_f8 = local_b8;
    local_fc = local_b8[0];
    local_108 = *in_RDI + 0x28;
    if (((local_b0 != 0) || (local_a8 == 0)) && ((local_b0 == 0 || (local_a8 != 0)))) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0x40f,"GGML_ASSERT(%s) failed",
                 "(!batch.token && batch.embd) || (batch.token && !batch.embd)");
    }
    this_00 = local_f0;
    this_01 = plStack_e8;
    this_02 = puStack_d8;
    __x = local_d0;
    this_03 = psStack_c8;
    n_ubatch = local_c0;
    if (local_b0 != 0) {
      for (local_118 = 0; (int)local_118 < (int)local_fc; local_118 = local_118 + 1) {
        if ((*(int *)(*(long *)(local_f8 + 2) + (long)(int)local_118 * 4) < 0) ||
           (uVar1 = *(uint *)(*(long *)(local_f8 + 2) + (long)(int)local_118 * 4),
           uVar4 = llama_vocab::n_tokens((llama_vocab *)0x3dc9e2), uVar4 <= uVar1)) {
          llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid token[%d] = %d\n","encode",
                             (ulong)local_118,
                             (ulong)*(uint *)(*(long *)(local_f8 + 2) + (long)(int)local_118 * 4));
          local_4 = -1;
          local_11c = 1;
          goto LAB_003dd493;
        }
      }
    }
    if (*(uint *)(in_RDI + 2) < local_fc) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0x41b,"GGML_ASSERT(%s) failed",
                 "cparams.n_ubatch >= (uint32_t) n_tokens && \"encoder requires n_ubatch >= n_tokens\""
                );
    }
    if (in_RDI[0x70] == 0) {
      in_stack_fffffffffffffe08 = (llama_context *)ggml_time_us();
      in_RDI[0x70] = (long)in_stack_fffffffffffffe08;
    }
    in_RDI[0x71] = in_RDI[0x71] + (long)(int)local_fc;
    local_128 = (ulong)*(uint *)(local_108 + 8);
    llama_sbatch::from_batch
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(size_t)in_stack_fffffffffffffdd0
               ,(bool)in_stack_fffffffffffffdcf,(bool)in_stack_fffffffffffffdce);
    iVar5 = (int32_t)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    llama_sbatch::split_simple(in_stack_fffffffffffffd60,n_ubatch);
    iVar5 = output_reserve(in_stack_fffffffffffffde8,iVar5);
    if (iVar5 < (int)local_fc) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: could not reserve space for batch with %u outputs\n","encode",
                         (ulong)local_fc);
      local_4 = -2;
      local_11c = 1;
    }
    else {
      for (local_16c = 0; gtype = (llm_graph_type)((ulong)in_stack_fffffffffffffde8 >> 0x20),
          local_16c < (int)local_fc; local_16c = local_16c + 1) {
        in_stack_fffffffffffffe00 = local_16c;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x51),(long)local_16c);
        *pvVar7 = in_stack_fffffffffffffe00;
      }
      *(uint *)(in_RDI + 0x50) = local_fc;
      pgVar8 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                         ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_01);
      ggml_backend_sched_reset(pgVar8);
      pgVar8 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                         ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_01);
      ggml_backend_sched_set_eval_callback(pgVar8,in_RDI[10],in_RDI[0xb]);
      local_16d = *(byte *)((long)in_RDI + 0x41) & 1;
      *(undefined1 *)((long)in_RDI + 0x41) = 0;
      gf_00 = graph_init(in_stack_fffffffffffffd80);
      batched = (undefined1)((ulong)in_stack_fffffffffffffd80 >> 0x38);
      local_178 = gf_00;
      std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                ((unique_ptr<ggml_context,_ggml_context_deleter> *)this_01);
      graph_build(in_stack_fffffffffffffe08,
                  (ggml_context *)CONCAT44(iVar5,in_stack_fffffffffffffe00),gf_00,
                  (llama_ubatch *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                  gtype);
      pgVar8 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                         ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_01);
      ggml_backend_sched_alloc_graph(pgVar8,local_178);
      plVar9 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
               operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                           *)0x3dcd2b);
      (*plVar9->_vptr_llm_graph_result_i[5])(plVar9,local_168);
      *(byte *)((long)in_RDI + 0x41) = local_16d & 1;
      local_184 = graph_compute(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(bool)batched);
      switch(local_184) {
      case GGML_STATUS_SUCCESS:
        plVar9 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
                 operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                             *)0x3dce42);
        iVar6 = (*plVar9->_vptr_llm_graph_result_i[4])();
        if (CONCAT44(extraout_var,iVar6) == 0) {
          plVar9 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
                   operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                               *)0x3dcea8);
          iVar6 = (*plVar9->_vptr_llm_graph_result_i[3])();
          local_190 = CONCAT17((char)((uint)extraout_var_01 >> 0x18),
                               CONCAT16((char)((uint)extraout_var_01 >> 0x10),
                                        (int6)CONCAT44(extraout_var_01,iVar6)));
        }
        else {
          plVar9 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
                   operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                               *)0x3dce73);
          iVar6 = (*plVar9->_vptr_llm_graph_result_i[4])();
          local_190 = CONCAT44(extraout_var_00,iVar6);
        }
        if (local_190 != 0) {
          pgVar8 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                             ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_01)
          ;
          local_198 = ggml_backend_sched_get_tensor_backend(pgVar8,local_190);
          if (local_198 == 0) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                       ,0x45c,"GGML_ASSERT(%s) failed","backend_embd != nullptr");
          }
          if (in_RDI[0x49] == 0) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                       ,0x45e,"GGML_ASSERT(%s) failed","embd != nullptr");
          }
          switch((int)in_RDI[9]) {
          case 0:
            if ((long)(int)local_fc * local_128 - in_RDI[0x48] != 0 &&
                in_RDI[0x48] <= (long)((long)(int)local_fc * local_128)) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                         ,0x464,"GGML_ASSERT(%s) failed","n_tokens*n_embd <= (int64_t) embd_size");
            }
            ggml_backend_tensor_get_async
                      (local_198,local_190,in_RDI[0x49],0,(long)(int)local_fc * local_128 * 4);
            break;
          case 1:
          case 2:
          case 3:
            local_1a0 = in_RDI + 0x4a;
            std::
            map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
            ::clear((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                     *)0x3dd077);
            if ((local_168[0] & 1) != 0) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                         ,0x46f,"GGML_ASSERT(%s) failed","!ubatch.equal_seqs");
            }
            for (local_1a4 = 0; local_1a4 < (int)local_fc; local_1a4 = local_1a4 + 1) {
              local_1a8 = **(int **)(local_138 + (long)local_1a4 * 8);
              local_1b0._M_node =
                   (_Base_ptr)
                   std::
                   map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ::find(this_00,(key_type *)0x3dd0f5);
              local_1b8._M_node =
                   (_Base_ptr)
                   std::
                   map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ::end(this_00);
              bVar3 = std::operator!=(&local_1b0,&local_1b8);
              if (!bVar3) {
                std::
                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[](in_stack_fffffffffffffd70,
                             (key_type *)
                             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
                std::vector<float,_std::allocator<float>_>::resize
                          ((vector<float,_std::allocator<float>_> *)this_03,(size_type)__x);
                lVar2 = local_190;
                lVar11 = local_198;
                std::
                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[](in_stack_fffffffffffffd70,
                             (key_type *)
                             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
                pfVar10 = std::vector<float,_std::allocator<float>_>::data
                                    ((vector<float,_std::allocator<float>_> *)0x3dd1ba);
                ggml_backend_tensor_get_async
                          (lVar11,lVar2,pfVar10,local_128 * (long)local_1a8 * 4,local_128 << 2);
              }
            }
            break;
          case 4:
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                       ,0x47f,"RANK pooling not implemented yet");
          case -1:
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                       ,0x483,"unknown pooling type");
          }
        }
        pgVar8 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                           ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_01);
        ggml_backend_sched_reset(pgVar8);
        if ((*(int *)(*in_RDI + 4) == 0x33) && (local_190 != 0)) {
          synchronize(this_01);
          in_RDI[0x3c] = *(long *)(local_190 + 0x10);
          in_RDI[0x3d] = *(long *)(local_190 + 0x18);
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)this_03,(size_type)__x);
          pfVar10 = std::vector<float,_std::allocator<float>_>::data
                              ((vector<float,_std::allocator<float>_> *)0x3dd2f7);
          __src = (void *)in_RDI[0x49];
          __n = ggml_nbytes(local_190);
          memcpy(pfVar10,__src,__n);
          std::
          vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          ::resize((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    *)this_03,(size_type)__x);
          for (local_1bc = 0; local_1bc < (int)local_fc; local_1bc = local_1bc + 1) {
            std::
            vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x41),(long)local_1bc);
            std::set<int,_std::less<int>,_std::allocator<int>_>::clear
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3dd3a0);
            for (local_1c0 = 0; local_1c0 < *(int *)(local_140 + (long)local_1bc * 4);
                local_1c0 = local_1c0 + 1) {
              std::
              vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x41),(long)local_1bc);
              std::set<int,_std::less<int>,_std::allocator<int>_>::insert(this_03,__x);
            }
          }
        }
        local_4 = 0;
        break;
      case GGML_STATUS_ABORTED:
        local_4 = 2;
        break;
      case GGML_STATUS_ALLOC_FAILED:
        local_4 = -2;
        break;
      case GGML_STATUS_FAILED:
      default:
        local_4 = -3;
      }
      local_11c = 1;
      std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::~unique_ptr
                (this_02);
    }
LAB_003dd493:
    llama_batch_allocr::~llama_batch_allocr((llama_batch_allocr *)this_01);
  }
  return local_4;
}

Assistant:

int llama_context::encode(llama_batch & inp_batch) {
    if (inp_batch.n_tokens == 0) {
        LLAMA_LOG_ERROR("%s: n_tokens == 0\n", __func__);
        return -1;
    }

    // temporary allocate memory for the input batch if needed
    // TODO: this is incorrect for multiple sequences because pos_max() is the maximum across all sequences
    llama_batch_allocr batch_allocr(inp_batch, inp_batch.pos ? -1 : kv_self->pos_max() + 1);

    const llama_batch & batch = batch_allocr.batch;
    const int32_t n_tokens = batch.n_tokens;

    const auto & hparams = model.hparams;

    GGML_ASSERT((!batch.token && batch.embd) || (batch.token && !batch.embd)); // NOLINT

    if (batch.token) {
        for (int32_t i = 0; i < n_tokens; ++i) {
            if (batch.token[i] < 0 || (uint32_t) batch.token[i] >= model.vocab.n_tokens()) {
                LLAMA_LOG_ERROR("%s: invalid token[%d] = %d\n", __func__, i, batch.token[i]);
                return -1;
            }
        }
    }

    // micro-batching is not possible for non-causal encoding, so we process the batch in a single shot
    GGML_ASSERT(cparams.n_ubatch >= (uint32_t) n_tokens && "encoder requires n_ubatch >= n_tokens");

    if (t_compute_start_us == 0) {
        t_compute_start_us = ggml_time_us();
    }

    n_queued_tokens += n_tokens;

    const int64_t n_embd = hparams.n_embd;

    sbatch.from_batch(batch, n_embd, /* simple_split */ true, /* logits_all */ true);

    const llama_ubatch ubatch = sbatch.split_simple(n_tokens);

    // reserve output buffer
    if (output_reserve(n_tokens) < n_tokens) {
        LLAMA_LOG_ERROR("%s: could not reserve space for batch with %u outputs\n", __func__, n_tokens);
        return -2;
    };

    for (int32_t i = 0; i < n_tokens; ++i) {
        output_ids[i] = i;
    }

    n_outputs = n_tokens;

    //batch_manager->prepare(ubatch);

    ggml_backend_sched_reset(sched.get());
    ggml_backend_sched_set_eval_callback(sched.get(), cparams.cb_eval, cparams.cb_eval_user_data);

    const auto causal_attn_org = cparams.causal_attn;

    // always use non-causal attention for encoder graphs
    // TODO: this is a tmp solution until we have a proper way to support enc-dec models
    //       ref: https://github.com/ggml-org/llama.cpp/pull/12181#issuecomment-2730451223
    cparams.causal_attn = false;

    auto * gf = graph_init();
    auto res = graph_build(ctx_compute.get(), gf, ubatch, LLM_GRAPH_TYPE_ENCODER);

    ggml_backend_sched_alloc_graph(sched.get(), gf);

    res->set_inputs(&ubatch);

    cparams.causal_attn = causal_attn_org;

    const auto compute_status = graph_compute(gf, n_tokens > 1);
    switch (compute_status) {
        case GGML_STATUS_SUCCESS:
            break;
        case GGML_STATUS_ABORTED:
            return 2;
        case GGML_STATUS_ALLOC_FAILED:
            return -2;
        case GGML_STATUS_FAILED:
        default:
            return -3;
    }

    auto * t_embd = res->get_embd_pooled() ? res->get_embd_pooled() : res->get_embd();

    // extract embeddings
    if (t_embd) {
        ggml_backend_t backend_embd = ggml_backend_sched_get_tensor_backend(sched.get(), t_embd);
        GGML_ASSERT(backend_embd != nullptr);

        GGML_ASSERT(embd != nullptr);

        switch (cparams.pooling_type) {
            case LLAMA_POOLING_TYPE_NONE:
                {
                    // extract token embeddings
                    GGML_ASSERT(n_tokens*n_embd <= (int64_t) embd_size);
                    ggml_backend_tensor_get_async(backend_embd, t_embd, embd, 0, n_tokens*n_embd*sizeof(float));
                } break;
            case LLAMA_POOLING_TYPE_MEAN:
            case LLAMA_POOLING_TYPE_CLS:
            case LLAMA_POOLING_TYPE_LAST:
                {
                    // extract sequence embeddings
                    auto & embd_seq_out = embd_seq;
                    embd_seq_out.clear();

                    GGML_ASSERT(!ubatch.equal_seqs); // TODO: handle equal splits

                    for (int32_t i = 0; i < n_tokens; i++) {
                        const llama_seq_id seq_id = ubatch.seq_id[i][0];
                        if (embd_seq_out.find(seq_id) != embd_seq_out.end()) {
                            continue;
                        }
                        embd_seq_out[seq_id].resize(n_embd);
                        ggml_backend_tensor_get_async(backend_embd, t_embd, embd_seq_out[seq_id].data(), (n_embd*seq_id)*sizeof(float), n_embd*sizeof(float));
                    }
                } break;
            case LLAMA_POOLING_TYPE_RANK:
                {
                    // TODO: this likely should be the same logic as in llama_decoder_internal, but better to
                    //       wait for an encoder model that requires this pooling type in order to test it
                    //       https://github.com/ggerganov/llama.cpp/pull/9510
                    GGML_ABORT("RANK pooling not implemented yet");
                }
            case LLAMA_POOLING_TYPE_UNSPECIFIED:
                {
                    GGML_ABORT("unknown pooling type");
                }
        }
    }

    // Reset state for the next token before backend sync, to allow the CPU activities in the reset to
    // overlap with device computation.
    ggml_backend_sched_reset(sched.get());

    // TODO: hacky solution
    if (model.arch == LLM_ARCH_T5 && t_embd) {
        //cross.t_embd = t_embd;

        synchronize();

        cross.n_embd = t_embd->ne[0];
        cross.n_enc  = t_embd->ne[1];
        cross.v_embd.resize(cross.n_embd*cross.n_enc);
        memcpy(cross.v_embd.data(), embd, ggml_nbytes(t_embd));

        // remember the sequence ids used during the encoding - needed for cross attention later
        cross.seq_ids_enc.resize(n_tokens);
        for (int32_t i = 0; i < n_tokens; i++) {
            cross.seq_ids_enc[i].clear();
            for (int s = 0; s < ubatch.n_seq_id[i]; s++) {
                llama_seq_id seq_id = ubatch.seq_id[i][s];
                cross.seq_ids_enc[i].insert(seq_id);
            }
        }
    }

    return 0;
}